

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O2

uchar rule_p2_p3(BidiType *types,size_t size)

{
  BidiType BVar1;
  ulong i;
  
  i = 0;
  do {
    if (size <= i) {
      return '\0';
    }
    BVar1 = types[i];
    if ((0x908U >> (BVar1 & (CS|AN)) & 1) == 0) {
      if ((1 << ((byte)BVar1 & 0x1f) & 0x31U) != 0) {
        return BVar1 != L;
      }
    }
    else {
      i = find_matching_pdi(types,i,size);
    }
    i = i + 1;
  } while( true );
}

Assistant:

static unsigned char rule_p2_p3(const BidiType *types, size_t size)
{
    /*
     * Rule P2. Find the first strong type (L, R or AL), ignoring
     * anything inside an isolated segment.
     *
     * Rule P3. If that type is R or AL, choose a paragraph embeddding
     * level of 1, otherwise 0.
     */
    for (size_t i = 0; i < size; i++) {
        BidiType t = types[i];
        if (typeIsIsolateInitiator(t))
            i = find_matching_pdi(types, i, size);
        else if (typeIsStrong(t))
            return (t == L ? 0 : 1);
    }

    return 0; /* default if no strong type found */
}